

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O3

void Lpk_PrintSets(Vec_Int_t *vSets)

{
  long lVar1;
  
  printf("Subsets(%d): ",(ulong)(uint)vSets->nSize);
  if (0 < vSets->nSize) {
    lVar1 = 0;
    do {
      Lpk_PrintSetOne(vSets->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vSets->nSize);
  }
  putchar(10);
  return;
}

Assistant:

static void Lpk_PrintSets( Vec_Int_t * vSets )
{
    unsigned uSupport;
    int Number, i;
    printf( "Subsets(%d): ", Vec_IntSize(vSets) );
    Vec_IntForEachEntry( vSets, Number, i )
    {
        uSupport = Number;
        Lpk_PrintSetOne( uSupport );
    }
    printf( "\n" );
}